

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void dump_regressor(vw *all,io_buf *buf,bool as_text)

{
  base_learner *pbVar1;
  string unused;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  save_load_header(all,buf,false,as_text,&local_40,all->options);
  for (pbVar1 = all->l; pbVar1 != (base_learner *)0x0; pbVar1 = *(base_learner **)(pbVar1 + 0x78)) {
    (**(code **)(pbVar1 + 0x80))(*(undefined8 *)(pbVar1 + 0x70),buf,0,as_text);
  }
  (*buf->_vptr_io_buf[7])(buf);
  (*buf->_vptr_io_buf[8])(buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void dump_regressor(vw& all, io_buf& buf, bool as_text)
{
  std::string unused;
  save_load_header(all, buf, false, as_text, unused, *all.options);
  if (all.l != nullptr)
    all.l->save_load(buf, false, as_text);

  buf.flush();  // close_file() should do this for me ...
  buf.close_file();
}